

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O3

void __thiscall fasttext::DenseMatrix::dump(DenseMatrix *this,ostream *out)

{
  pointer pfVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  poVar2 = std::ostream::_M_insert<long>((long)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (0 < (this->super_Matrix).m_) {
    lVar5 = 0;
    do {
      lVar3 = (this->super_Matrix).n_;
      if (0 < lVar3) {
        lVar6 = 0;
        do {
          if (lVar6 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
            lVar3 = (this->super_Matrix).n_;
          }
          pfVar1 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar4 = lVar3 * lVar5 + lVar6;
          if ((ulong)((long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pfVar1 >> 2) <= uVar4) {
            __assert_fail("i * n_ + j < data_.size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/densematrix.h"
                          ,0x2d,"const real &fasttext::DenseMatrix::at(int64_t, int64_t) const");
          }
          std::ostream::_M_insert<double>((double)pfVar1[uVar4]);
          lVar3 = (this->super_Matrix).n_;
          lVar6 = lVar6 + 1;
        } while (lVar6 < lVar3);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
      std::ostream::put((char)out);
      std::ostream::flush();
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->super_Matrix).m_);
  }
  return;
}

Assistant:

void DenseMatrix::dump(std::ostream& out) const {
  out << m_ << " " << n_ << std::endl;
  for (int64_t i = 0; i < m_; i++) {
    for (int64_t j = 0; j < n_; j++) {
      if (j > 0) {
        out << " ";
      }
      out << at(i, j);
    }
    out << std::endl;
  }
}